

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall resetOnEndTimeFixture::createSession(resetOnEndTimeFixture *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  sessionFixture *psVar5;
  sessionFixture *psVar6;
  ulong uVar7;
  int local_20;
  int64_t local_18;
  
  FIX::DateTime::nowUtc();
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_date =
       local_20;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.m_time =
       local_18;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_date =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_date;
  *(undefined4 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
    super_DateTime.field_0xc =
       *(undefined4 *)
        &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
         field_0xc;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time =
       (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.now.super_DateTime.
       m_time;
  iVar4 = (int)((this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp
                .super_DateTime.m_time / 1000000000);
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
  super_DateTime.m_time =
       ((long)(iVar4 % 0x3c) + (long)(iVar4 / 0xe10) * 0xe10 +
       (long)(((iVar4 / 0x3c) % 0x3c) * 0x3c)) * 1000000000;
  psVar5 = &(this->super_acceptorFixture).super_sessionFixture;
  uVar1 = *(undefined4 *)&(psVar5->super_TestCallback).startTimeStamp.super_DateTime.field_0xc;
  psVar6 = &(this->super_acceptorFixture).super_sessionFixture;
  (psVar6->super_TestCallback).endTimeStamp.super_DateTime.m_date =
       (psVar5->super_TestCallback).startTimeStamp.super_DateTime.m_date;
  *(undefined4 *)&(psVar6->super_TestCallback).endTimeStamp.super_DateTime.field_0xc = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTimeStamp.super_DateTime.
  m_time = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
           super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
  m_date = 0;
  uVar2 = *(undefined8 *)
           &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTimeStamp.
            super_DateTime.field_0xc;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.super_DateTime.
    field_0xc = uVar2;
  uVar1 = *(undefined4 *)
           ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.
                   startTimeStamp.super_DateTime.m_time + 4);
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.startTime.
           super_DateTime.m_time + 4) = uVar1;
  *(undefined8 *)
   &(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    field_0xc = uVar2;
  *(undefined4 *)
   ((long)&(this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
           super_DateTime.m_time + 4) = uVar1;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_date = 0;
  lVar3 = (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.
          super_DateTime.m_time;
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = lVar3 + 2000000000U;
  if (lVar3 < 0x4e941a196c00) {
    if (-0x77359401 < lVar3) goto LAB_00282bf4;
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = -1;
    uVar7 = lVar3 + 0x4e9508849400;
  }
  else {
    (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
    m_date = 1;
    uVar7 = (lVar3 + 2000000000U) % 86400000000000;
  }
  (this->super_acceptorFixture).super_sessionFixture.super_TestCallback.endTime.super_DateTime.
  m_time = uVar7;
LAB_00282bf4:
  anon_unknown.dwarf_52c65e::sessionFixture::createSession((sessionFixture *)this,0,-1,-1);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }